

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scheduler.cpp
# Opt level: O1

void Repeat(CScheduler *s,Function *f,milliseconds delta)

{
  Function f_00;
  undefined8 uVar1;
  long in_FS_OFFSET;
  CScheduler *pCVar2;
  undefined8 in_stack_ffffffffffffff90;
  undefined8 in_stack_ffffffffffffff98;
  _Invoker_type in_stack_ffffffffffffffa0;
  undefined8 uStack_58;
  undefined8 *local_48;
  undefined8 uStack_40;
  code *local_38;
  code *pcStack_30;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  if ((f->super__Function_base)._M_manager == (_Manager_type)0x0) {
    if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
      uVar1 = std::__throw_bad_function_call();
      __clang_call_terminate(uVar1);
    }
  }
  else {
    (*f->_M_invoker)((_Any_data *)f);
    pCVar2 = s;
    wallet::_GLOBAL__N_1::std::function<void_()>::function
              ((function<void_()> *)&stack0xffffffffffffff90,(function<void_()> *)f);
    local_48 = (undefined8 *)0x0;
    uStack_40 = 0;
    local_38 = (code *)0x0;
    pcStack_30 = (code *)0x0;
    local_48 = (undefined8 *)operator_new(0x30);
    *local_48 = pCVar2;
    local_48[1] = 0;
    local_48[2] = 0;
    local_48[3] = 0;
    local_48[4] = uStack_58;
    if (in_stack_ffffffffffffffa0 != (_Invoker_type)0x0) {
      local_48[1] = in_stack_ffffffffffffff90;
      local_48[2] = in_stack_ffffffffffffff98;
      local_48[3] = in_stack_ffffffffffffffa0;
      in_stack_ffffffffffffffa0 = (_Invoker_type)0x0;
    }
    local_48[5] = delta.__r;
    pcStack_30 = std::
                 _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/scheduler.cpp:105:23)>
                 ::_M_invoke;
    local_38 = std::
               _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/scheduler.cpp:105:23)>
               ::_M_manager;
    f_00.super__Function_base._M_functor._8_8_ = in_stack_ffffffffffffff90;
    f_00.super__Function_base._M_functor._M_unused._M_object = pCVar2;
    f_00.super__Function_base._M_manager = (_Manager_type)in_stack_ffffffffffffff98;
    f_00._M_invoker = in_stack_ffffffffffffffa0;
    CScheduler::scheduleFromNow(s,f_00,(milliseconds)&local_48);
    if (local_38 != (code *)0x0) {
      (*local_38)(&local_48,&local_48,3);
    }
    if (in_stack_ffffffffffffffa0 != (_Invoker_type)0x0) {
      (*in_stack_ffffffffffffffa0)
                ((_Any_data *)&stack0xffffffffffffff90,(_Any_data *)&stack0xffffffffffffff90,
                 __destroy_functor);
    }
    if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
      return;
    }
  }
  __stack_chk_fail();
}

Assistant:

static void Repeat(CScheduler& s, CScheduler::Function f, std::chrono::milliseconds delta)
{
    f();
    s.scheduleFromNow([=, &s] { Repeat(s, f, delta); }, delta);
}